

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O2

void anon_unknown.dwarf_3ea68::parseInput(Module *wasm,WasmSplitOptions *options)

{
  char cVar1;
  uint uVar2;
  undefined1 local_1f0 [424];
  string local_48 [36];
  undefined2 local_24 [2];
  IRProfile local_20;
  undefined1 local_1c;
  
  uVar2 = (wasm->features).features | (options->super_ToolOptions).enabledFeatures.features;
  (wasm->features).features = uVar2;
  (wasm->features).features = ~(options->super_ToolOptions).disabledFeatures.features & uVar2;
  local_1c = 0;
  local_24[0] = 1;
  local_20 = (options->super_ToolOptions).profile;
  std::__cxx11::string::string
            ((string *)(local_1f0 + 0x188),
             (string *)
             (options->inputFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",(allocator<char> *)local_1f0);
  ::wasm::ModuleReader::read(local_24,local_1f0 + 0x188,wasm,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string((string *)(local_1f0 + 0x188));
  ::wasm::ToolOptions::applyOptionsAfterParse(&options->super_ToolOptions,wasm);
  if ((options->super_ToolOptions).passOptions.validate != false) {
    cVar1 = ::wasm::WasmValidator::validate((Module *)local_1f0,(uint)wasm);
    if (cVar1 == '\0') {
      ::wasm::Fatal::Fatal((Fatal *)local_1f0);
      ::wasm::Fatal::operator<<((Fatal *)local_1f0,(char (*) [23])"error validating input");
      ::wasm::Fatal::~Fatal((Fatal *)local_1f0);
    }
  }
  return;
}

Assistant:

void parseInput(Module& wasm, const WasmSplitOptions& options) {
  options.applyOptionsBeforeParse(wasm);
  ModuleReader reader;
  reader.setProfile(options.profile);
  try {
    reader.read(options.inputFiles[0], wasm);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error parsing wasm";
  } catch (std::bad_alloc&) {
    Fatal() << "error building module, std::bad_alloc (possibly invalid "
               "request for silly amounts of memory)";
  }

  options.applyOptionsAfterParse(wasm);

  if (options.passOptions.validate && !WasmValidator().validate(wasm)) {
    Fatal() << "error validating input";
  }
}